

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O1

errr next_blockheader(ang_file *f,blockheader *b)

{
  int iVar1;
  errr eVar2;
  uint uVar3;
  uint uVar4;
  uint8_t savefile_head [28];
  char acStack_38 [15];
  char local_29;
  uint32_t local_28;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  
  iVar1 = file_read(f,acStack_38,0x1c);
  if (iVar1 == 0) {
    eVar2 = 1;
  }
  else {
    eVar2 = -1;
    if ((iVar1 == 0x1c) && (local_29 == '\0')) {
      my_strcpy(b->name,acStack_38,0x10);
      b->version = local_28;
      uVar3 = (uint)local_21 << 0x18 | (uint)local_22 << 0x10 | (uint)local_23 << 8 | (uint)local_24
      ;
      uVar4 = (uVar3 - (local_24 & 3)) + 4;
      if ((local_24 & 3) == 0) {
        uVar4 = uVar3;
      }
      b->size = uVar4;
      eVar2 = 0;
    }
  }
  return eVar2;
}

Assistant:

static errr next_blockheader(ang_file *f, struct blockheader *b) {
	uint8_t savefile_head[SAVEFILE_HEAD_SIZE];
	size_t len;

	len = file_read(f, (char *)savefile_head, SAVEFILE_HEAD_SIZE);
	if (len == 0) /* no more blocks */
		return 1;

	if (len != SAVEFILE_HEAD_SIZE || savefile_head[15] != 0) {
		return -1;
	}

#define RECONSTRUCT_U32B(from) \
	((uint32_t) savefile_head[from]) | \
	((uint32_t) savefile_head[from+1] << 8) | \
	((uint32_t) savefile_head[from+2] << 16) | \
	((uint32_t) savefile_head[from+3] << 24);

	my_strcpy(b->name, (char *)&savefile_head, sizeof b->name);
	b->version = RECONSTRUCT_U32B(16);
	b->size = RECONSTRUCT_U32B(20);

	/* Pad to 4 bytes */
	if (b->size % 4)
		b->size += 4 - (b->size % 4);

	return 0;
}